

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetJoin.cpp
# Opt level: O2

void __thiscall
SetJoinPlugin::OnJoin(SetJoinPlugin *this,Client *server,string_view chan,string_view nick)

{
  undefined8 uVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *args_3;
  string_view setjoin;
  string_view nick_local;
  string join_message;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  pbVar3 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_str;
  sVar2 = nick._M_len;
  args_3 = pbVar3;
  nick_local._M_len = sVar2;
  nick_local._M_str = (char *)pbVar3;
  uVar1 = Jupiter::IRC::Client::getConfigSection();
  uVar1 = Jupiter::Config::operator[](&this->field_0x38,uVar1);
  setjoin = (string_view)Jupiter::Config::get(uVar1,sVar2,pbVar3,0,0);
  if (setjoin._M_len != 0) {
    local_40 = 5;
    local_38 = "\x02\x0307[";
    local_50._M_len = 5;
    local_50._M_str = "]\x03\x02: ";
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&>
              (&join_message,(jessilib *)&local_40,&nick_local,&local_50,&setjoin,args_3);
    Jupiter::IRC::Client::sendMessage
              (server,chan._M_len,chan._M_str,join_message._M_string_length,
               join_message._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&join_message);
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (server,sVar2,pbVar3,0x45,
             "No setjoin has been set for you. To set one, use the !setjoin command");
  return;
}

Assistant:

void SetJoinPlugin::OnJoin(Jupiter::IRC::Client *server, std::string_view chan, std::string_view nick) {
	std::string_view setjoin = this->config[server->getConfigSection()].get(nick);
	if (setjoin.empty()) {
		server->sendNotice(nick, "No setjoin has been set for you. To set one, use the !setjoin command"sv);
		return;
	}

	std::string join_message = jessilib::join<std::string>(IRCBOLD IRCCOLOR "07["sv, nick, "]" IRCCOLOR IRCBOLD ": "sv, setjoin);
	server->sendMessage(chan, join_message);
}